

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

UserGeometry * __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::getMesh
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,size_t objectID
          )

{
  Geometry *pGVar1;
  Geometry *pGVar2;
  
  pGVar1 = (this->scene->geometries).items[objectID].ptr;
  pGVar2 = (Geometry *)0x0;
  if ((pGVar1 != (Geometry *)0x0) && (*(char *)&pGVar1->field_8 == '\x1d')) {
    pGVar2 = pGVar1;
  }
  return (UserGeometry *)pGVar2;
}

Assistant:

Mesh* getMesh (size_t objectID) {
        return this->scene->template getSafe<Mesh>(objectID);
      }